

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O2

void __thiscall
cfgfile::input_stream_t<cfgfile::qstring_trait_t>::input_stream_t
          (input_stream_t<cfgfile::qstring_trait_t> *this,string_t *file_name,istream_t *input)

{
  this->m_stream = input;
  this->m_line_number = 1;
  this->m_column_number = 1;
  std::
  stack<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,std::deque<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>>>
  ::
  stack<std::deque<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>>,void>
            (&this->m_prev_positions);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&this->m_file_name,
             (QArrayDataPointer<char16_t> *)file_name);
  std::stack<QChar,std::deque<QChar,std::allocator<QChar>>>::
  stack<std::deque<QChar,std::allocator<QChar>>,void>(&this->m_returned_char);
  this->m_stream_size = 0;
  this->m_stream_pos = 0;
  (this->m_buf).d.size = 0;
  this->m_buf_pos = 0;
  (this->m_buf).d.d = (Data *)0x0;
  (this->m_buf).d.ptr = (char16_t *)0x0;
  qstring_trait_t::fill_buf(this->m_stream,&this->m_buf,0x200,&this->m_stream_pos,0);
  return;
}

Assistant:

input_stream_t( const typename Trait::string_t & file_name,
		typename Trait::istream_t & input )
		:	m_stream( input )
		,	m_line_number( 1 )
		,	m_column_number( 1 )
		,	m_file_name( file_name )
		,	m_buf_pos( 0 )
		,	m_stream_pos( 0 )
	{
		Trait::noskipws( m_stream );

		m_stream_size = Trait::size_of_file( m_stream );

		if( m_stream_size < 0 )
			m_stream_size = 0;

		Trait::fill_buf( m_stream, m_buf, c_buff_size, m_stream_pos, m_stream_size );
	}